

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Scene *pSVar4;
  Ref<embree::Geometry> *pRVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 (*pauVar30) [16];
  int iVar31;
  uint uVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  ulong uVar55;
  Geometry *pGVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  float fVar138;
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined4 uVar143;
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar144 [32];
  float fVar147;
  float fVar149;
  float fVar151;
  undefined1 auVar145 [32];
  float fVar155;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar162;
  float fVar165;
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1550 [16];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined4 uStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float local_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar54 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar143 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1370._4_4_ = uVar143;
  local_1370._0_4_ = uVar143;
  local_1370._8_4_ = uVar143;
  local_1370._12_4_ = uVar143;
  auVar117 = ZEXT1664(local_1370);
  uVar143 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = uVar143;
  local_1380._0_4_ = uVar143;
  local_1380._8_4_ = uVar143;
  local_1380._12_4_ = uVar143;
  auVar122 = ZEXT1664(local_1380);
  uVar143 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1390._4_4_ = uVar143;
  local_1390._0_4_ = uVar143;
  local_1390._8_4_ = uVar143;
  local_1390._12_4_ = uVar143;
  auVar132 = ZEXT1664(local_1390);
  fVar141 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar155 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar162 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar133 = fVar141 * 0.99999964;
  fVar138 = fVar155 * 0.99999964;
  fVar140 = fVar162 * 0.99999964;
  fVar141 = fVar141 * 1.0000004;
  fVar155 = fVar155 * 1.0000004;
  fVar162 = fVar162 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar31 = (tray->tnear).field_0.i[k];
  local_1550._4_4_ = iVar31;
  local_1550._0_4_ = iVar31;
  local_1550._8_4_ = iVar31;
  local_1550._12_4_ = iVar31;
  auVar114 = ZEXT1664(local_1550);
  iVar31 = (tray->tfar).field_0.i[k];
  auVar63 = ZEXT1664(CONCAT412(iVar31,CONCAT48(iVar31,CONCAT44(iVar31,iVar31))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar31 = 1 << ((uint)k & 0x1f);
  auVar67._4_4_ = iVar31;
  auVar67._0_4_ = iVar31;
  auVar67._8_4_ = iVar31;
  auVar67._12_4_ = iVar31;
  auVar67._16_4_ = iVar31;
  auVar67._20_4_ = iVar31;
  auVar67._24_4_ = iVar31;
  auVar67._28_4_ = iVar31;
  auVar68 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar67 = vpand_avx2(auVar67,auVar68);
  local_1140 = vpcmpeqd_avx2(auVar67,auVar68);
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar73._16_4_ = 0x3f800000;
  auVar73._20_4_ = 0x3f800000;
  auVar73._24_4_ = 0x3f800000;
  auVar73._28_4_ = 0x3f800000;
  auVar68._8_4_ = 0xbf800000;
  auVar68._0_8_ = 0xbf800000bf800000;
  auVar68._12_4_ = 0xbf800000;
  auVar68._16_4_ = 0xbf800000;
  auVar68._20_4_ = 0xbf800000;
  auVar68._24_4_ = 0xbf800000;
  auVar68._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar73,auVar68,local_1100);
  fVar136 = fVar133;
  fVar137 = fVar133;
  fVar99 = fVar133;
  fVar105 = fVar138;
  fVar106 = fVar138;
  fVar107 = fVar138;
  fVar108 = fVar140;
  fVar109 = fVar140;
  fVar110 = fVar140;
  fVar146 = fVar141;
  fVar148 = fVar141;
  fVar150 = fVar141;
  fVar159 = fVar155;
  fVar160 = fVar155;
  fVar161 = fVar155;
  fVar165 = fVar162;
  fVar118 = fVar162;
  fVar123 = fVar162;
  local_13f0 = fVar162;
  fStack_13ec = fVar162;
  fStack_13e8 = fVar162;
  fStack_13e4 = fVar162;
  local_13e0 = fVar155;
  fStack_13dc = fVar155;
  fStack_13d8 = fVar155;
  fStack_13d4 = fVar155;
  local_13d0 = fVar141;
  fStack_13cc = fVar141;
  fStack_13c8 = fVar141;
  fStack_13c4 = fVar141;
  local_13c0 = fVar140;
  fStack_13bc = fVar140;
  fStack_13b8 = fVar140;
  fStack_13b4 = fVar140;
  local_13b0 = fVar138;
  fStack_13ac = fVar138;
  fStack_13a8 = fVar138;
  fStack_13a4 = fVar138;
  local_13a0 = fVar133;
  fStack_139c = fVar133;
  fStack_1398 = fVar133;
  fStack_1394 = fVar133;
LAB_0160e181:
  do {
    do {
      if (pauVar54 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar30 = pauVar54 + -1;
      pauVar54 = pauVar54 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar30 + 8));
    uVar38 = *(ulong *)*pauVar54;
    while ((uVar38 & 8) == 0) {
      uVar33 = uVar38 & 0xfffffffffffffff0;
      uVar143 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar64._4_4_ = uVar143;
      auVar64._0_4_ = uVar143;
      auVar64._8_4_ = uVar143;
      auVar64._12_4_ = uVar143;
      auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar41),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar41));
      auVar65 = vsubps_avx(auVar65,auVar117._0_16_);
      auVar76._0_4_ = fVar133 * auVar65._0_4_;
      auVar76._4_4_ = fVar136 * auVar65._4_4_;
      auVar76._8_4_ = fVar137 * auVar65._8_4_;
      auVar76._12_4_ = fVar99 * auVar65._12_4_;
      auVar65 = vmaxps_avx(auVar114._0_16_,auVar76);
      auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar57),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar57));
      auVar76 = vsubps_avx(auVar76,auVar122._0_16_);
      auVar84._0_4_ = fVar138 * auVar76._0_4_;
      auVar84._4_4_ = fVar105 * auVar76._4_4_;
      auVar84._8_4_ = fVar106 * auVar76._8_4_;
      auVar84._12_4_ = fVar107 * auVar76._12_4_;
      auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + uVar58),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + uVar58));
      auVar76 = vsubps_avx(auVar76,auVar132._0_16_);
      auVar91._0_4_ = fVar140 * auVar76._0_4_;
      auVar91._4_4_ = fVar108 * auVar76._4_4_;
      auVar91._8_4_ = fVar109 * auVar76._8_4_;
      auVar91._12_4_ = fVar110 * auVar76._12_4_;
      auVar76 = vmaxps_avx(auVar84,auVar91);
      local_1300 = vmaxps_avx(auVar65,auVar76);
      auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + (uVar41 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + (uVar41 ^ 0x10)));
      auVar65 = vsubps_avx(auVar65,auVar117._0_16_);
      auVar85._0_4_ = fVar141 * auVar65._0_4_;
      auVar85._4_4_ = fVar146 * auVar65._4_4_;
      auVar85._8_4_ = fVar148 * auVar65._8_4_;
      auVar85._12_4_ = fVar150 * auVar65._12_4_;
      auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + (uVar57 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + (uVar57 ^ 0x10)));
      auVar65 = vminps_avx(auVar63._0_16_,auVar85);
      auVar76 = vsubps_avx(auVar76,auVar122._0_16_);
      auVar92._0_4_ = fVar155 * auVar76._0_4_;
      auVar92._4_4_ = fVar159 * auVar76._4_4_;
      auVar92._8_4_ = fVar160 * auVar76._8_4_;
      auVar92._12_4_ = fVar161 * auVar76._12_4_;
      auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80 + (uVar58 ^ 0x10)),auVar64,
                                *(undefined1 (*) [16])(uVar33 + 0x20 + (uVar58 ^ 0x10)));
      auVar76 = vsubps_avx(auVar76,auVar132._0_16_);
      auVar100._0_4_ = fVar162 * auVar76._0_4_;
      auVar100._4_4_ = fVar165 * auVar76._4_4_;
      auVar100._8_4_ = fVar118 * auVar76._8_4_;
      auVar100._12_4_ = fVar123 * auVar76._12_4_;
      auVar76 = vminps_avx(auVar92,auVar100);
      auVar65 = vminps_avx(auVar65,auVar76);
      if (((uint)uVar38 & 7) == 6) {
        auVar76 = vcmpps_avx(local_1300,auVar65,2);
        auVar65 = vcmpps_avx(*(undefined1 (*) [16])(uVar33 + 0xe0),auVar64,2);
        auVar64 = vcmpps_avx(auVar64,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
        auVar65 = vandps_avx(auVar65,auVar64);
        auVar65 = vandps_avx(auVar65,auVar76);
      }
      else {
        auVar65 = vcmpps_avx(local_1300,auVar65,2);
      }
      auVar65 = vpslld_avx(auVar65,0x1f);
      uVar36 = vmovmskps_avx(auVar65);
      if (uVar36 == 0) goto LAB_0160e181;
      uVar36 = uVar36 & 0xff;
      lVar35 = 0;
      for (uVar38 = (ulong)uVar36; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar35 = lVar35 + 1;
      }
      uVar38 = *(ulong *)(uVar33 + lVar35 * 8);
      uVar36 = uVar36 - 1 & uVar36;
      uVar37 = (ulong)uVar36;
      if (uVar36 != 0) {
        uVar32 = *(uint *)(local_1300 + lVar35 * 4);
        lVar35 = 0;
        for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar35 = lVar35 + 1;
        }
        uVar36 = uVar36 - 1 & uVar36;
        uVar40 = (ulong)uVar36;
        uVar37 = *(ulong *)(uVar33 + lVar35 * 8);
        uVar3 = *(uint *)(local_1300 + lVar35 * 4);
        if (uVar36 == 0) {
          if (uVar32 < uVar3) {
            *(ulong *)*pauVar54 = uVar37;
            *(uint *)(*pauVar54 + 8) = uVar3;
            pauVar54 = pauVar54 + 1;
          }
          else {
            *(ulong *)*pauVar54 = uVar38;
            *(uint *)(*pauVar54 + 8) = uVar32;
            pauVar54 = pauVar54 + 1;
            uVar38 = uVar37;
          }
        }
        else {
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar38;
          auVar65 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar32));
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar37;
          auVar76 = vpunpcklqdq_avx(auVar77,ZEXT416(uVar3));
          lVar35 = 0;
          for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
            lVar35 = lVar35 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          uVar38 = (ulong)uVar36;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(uVar33 + lVar35 * 8);
          auVar84 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_1300 + lVar35 * 4)));
          auVar64 = vpcmpgtd_avx(auVar76,auVar65);
          if (uVar36 == 0) {
            auVar85 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar76,auVar65,auVar85);
            auVar65 = vblendvps_avx(auVar65,auVar76,auVar85);
            auVar76 = vpcmpgtd_avx(auVar84,auVar64);
            auVar85 = vpshufd_avx(auVar76,0xaa);
            auVar76 = vblendvps_avx(auVar84,auVar64,auVar85);
            auVar64 = vblendvps_avx(auVar64,auVar84,auVar85);
            auVar84 = vpcmpgtd_avx(auVar64,auVar65);
            auVar85 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar64,auVar65,auVar85);
            auVar65 = vblendvps_avx(auVar65,auVar64,auVar85);
            *pauVar54 = auVar65;
            pauVar54[1] = auVar84;
            uVar38 = auVar76._0_8_;
            pauVar54 = pauVar54 + 2;
          }
          else {
            lVar35 = 0;
            for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              lVar35 = lVar35 + 1;
            }
            auVar101._8_8_ = 0;
            auVar101._0_8_ = *(ulong *)(uVar33 + lVar35 * 8);
            auVar91 = vpunpcklqdq_avx(auVar101,ZEXT416(*(uint *)(local_1300 + lVar35 * 4)));
            auVar85 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar76,auVar65,auVar85);
            auVar65 = vblendvps_avx(auVar65,auVar76,auVar85);
            auVar76 = vpcmpgtd_avx(auVar91,auVar84);
            auVar85 = vpshufd_avx(auVar76,0xaa);
            auVar76 = vblendvps_avx(auVar91,auVar84,auVar85);
            auVar84 = vblendvps_avx(auVar84,auVar91,auVar85);
            auVar85 = vpcmpgtd_avx(auVar84,auVar65);
            auVar91 = vpshufd_avx(auVar85,0xaa);
            auVar85 = vblendvps_avx(auVar84,auVar65,auVar91);
            auVar65 = vblendvps_avx(auVar65,auVar84,auVar91);
            auVar84 = vpcmpgtd_avx(auVar76,auVar64);
            auVar91 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar76,auVar64,auVar91);
            auVar76 = vblendvps_avx(auVar64,auVar76,auVar91);
            auVar64 = vpcmpgtd_avx(auVar85,auVar76);
            auVar91 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar85,auVar76,auVar91);
            auVar76 = vblendvps_avx(auVar76,auVar85,auVar91);
            *pauVar54 = auVar65;
            pauVar54[1] = auVar76;
            pauVar54[2] = auVar64;
            auVar114 = ZEXT1664(local_1550);
            uVar38 = auVar84._0_8_;
            pauVar54 = pauVar54 + 3;
          }
        }
      }
    }
    uVar33 = uVar38 & 0xfffffffffffffff0;
    for (lVar35 = 0; lVar35 != (ulong)((uint)uVar38 & 0xf) - 8; lVar35 = lVar35 + 1) {
      lVar34 = lVar35 * 0x60;
      pSVar4 = context->scene;
      pRVar5 = (pSVar4->geometries).items;
      pGVar56 = pRVar5[*(uint *)(uVar33 + 0x40 + lVar34)].ptr;
      fVar141 = (pGVar56->time_range).lower;
      fVar141 = pGVar56->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar141) /
                ((pGVar56->time_range).upper - fVar141));
      auVar65 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
      auVar65 = vminss_avx(auVar65,ZEXT416((uint)(pGVar56->fnumTimeSegments + -1.0)));
      auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar65);
      iVar31 = (int)auVar78._0_4_;
      lVar48 = (long)iVar31 * 0x38;
      lVar6 = *(long *)(*(long *)&pGVar56[2].numPrimitives + lVar48);
      uVar36 = *(uint *)(uVar33 + 4 + lVar34);
      auVar65 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar33 + lVar34) * 4);
      uVar40 = (ulong)*(uint *)(uVar33 + 0x10 + lVar34);
      auVar76 = *(undefined1 (*) [16])(lVar6 + uVar40 * 4);
      uVar42 = (ulong)*(uint *)(uVar33 + 0x20 + lVar34);
      auVar64 = *(undefined1 (*) [16])(lVar6 + uVar42 * 4);
      uVar43 = (ulong)*(uint *)(uVar33 + 0x30 + lVar34);
      auVar84 = *(undefined1 (*) [16])(lVar6 + uVar43 * 4);
      lVar6 = *(long *)&pRVar5[*(uint *)(uVar33 + 0x44 + lVar34)].ptr[2].numPrimitives;
      lVar7 = *(long *)(lVar6 + lVar48);
      auVar85 = *(undefined1 (*) [16])(lVar7 + (ulong)uVar36 * 4);
      uVar44 = (ulong)*(uint *)(uVar33 + 0x14 + lVar34);
      auVar91 = *(undefined1 (*) [16])(lVar7 + uVar44 * 4);
      uVar45 = (ulong)*(uint *)(uVar33 + 0x24 + lVar34);
      auVar92 = *(undefined1 (*) [16])(lVar7 + uVar45 * 4);
      uVar46 = (ulong)*(uint *)(uVar33 + 0x34 + lVar34);
      auVar100 = *(undefined1 (*) [16])(lVar7 + uVar46 * 4);
      lVar7 = *(long *)&pRVar5[*(uint *)(uVar33 + 0x48 + lVar34)].ptr[2].numPrimitives;
      lVar8 = *(long *)(lVar7 + lVar48);
      uVar47 = (ulong)*(uint *)(uVar33 + 8 + lVar34);
      auVar77 = *(undefined1 (*) [16])(lVar8 + uVar47 * 4);
      uVar51 = (ulong)*(uint *)(uVar33 + 0x18 + lVar34);
      auVar86 = *(undefined1 (*) [16])(lVar8 + uVar51 * 4);
      uVar52 = (ulong)*(uint *)(uVar33 + 0x28 + lVar34);
      auVar101 = *(undefined1 (*) [16])(lVar8 + uVar52 * 4);
      uVar53 = (ulong)*(uint *)(uVar33 + 0x38 + lVar34);
      auVar2 = *(undefined1 (*) [16])(lVar8 + uVar53 * 4);
      fVar141 = fVar141 - auVar78._0_4_;
      lVar8 = *(long *)&pRVar5[*(uint *)(uVar33 + 0x4c + lVar34)].ptr[2].numPrimitives;
      lVar48 = *(long *)(lVar8 + lVar48);
      uVar37 = (ulong)*(uint *)(uVar33 + 0xc + lVar34);
      auVar78 = *(undefined1 (*) [16])(lVar48 + uVar37 * 4);
      uVar49 = (ulong)*(uint *)(uVar33 + 0x1c + lVar34);
      auVar59 = *(undefined1 (*) [16])(lVar48 + uVar49 * 4);
      auVar115 = vunpcklps_avx(auVar65,auVar77);
      auVar77 = vunpckhps_avx(auVar65,auVar77);
      auVar119 = vunpcklps_avx(auVar85,auVar78);
      auVar85 = vunpckhps_avx(auVar85,auVar78);
      uVar50 = (ulong)*(uint *)(uVar33 + 0x2c + lVar34);
      auVar65 = *(undefined1 (*) [16])(lVar48 + uVar50 * 4);
      auVar78 = vunpcklps_avx(auVar77,auVar85);
      local_1330 = vunpcklps_avx(auVar115,auVar119);
      auVar85 = vunpckhps_avx(auVar115,auVar119);
      auVar115 = vunpcklps_avx(auVar76,auVar86);
      auVar77 = vunpckhps_avx(auVar76,auVar86);
      auVar86 = vunpcklps_avx(auVar91,auVar59);
      auVar91 = vunpckhps_avx(auVar91,auVar59);
      uVar55 = (ulong)*(uint *)(uVar33 + 0x3c + lVar34);
      auVar76 = *(undefined1 (*) [16])(lVar48 + uVar55 * 4);
      auVar77 = vunpcklps_avx(auVar77,auVar91);
      auVar59 = vunpcklps_avx(auVar115,auVar86);
      auVar91 = vunpckhps_avx(auVar115,auVar86);
      auVar86 = vunpcklps_avx(auVar64,auVar101);
      auVar64 = vunpckhps_avx(auVar64,auVar101);
      auVar101 = vunpcklps_avx(auVar92,auVar65);
      auVar92 = vunpckhps_avx(auVar92,auVar65);
      lVar39 = (long)(iVar31 + 1) * 0x38;
      lVar48 = *(long *)(*(long *)&pGVar56[2].numPrimitives + lVar39);
      auVar65 = *(undefined1 (*) [16])(lVar48 + (ulong)*(uint *)(uVar33 + lVar34) * 4);
      auVar115 = vunpcklps_avx(auVar64,auVar92);
      auVar119 = vunpcklps_avx(auVar86,auVar101);
      local_1360 = vunpckhps_avx(auVar86,auVar101);
      auVar92 = vunpcklps_avx(auVar84,auVar2);
      auVar64 = vunpckhps_avx(auVar84,auVar2);
      auVar86 = vunpcklps_avx(auVar100,auVar76);
      auVar84 = vunpckhps_avx(auVar100,auVar76);
      lVar7 = *(long *)(lVar7 + lVar39);
      auVar76 = *(undefined1 (*) [16])(lVar7 + uVar47 * 4);
      auVar101 = vunpcklps_avx(auVar64,auVar84);
      local_1340 = vunpcklps_avx(auVar92,auVar86);
      local_1350 = vunpckhps_avx(auVar92,auVar86);
      lVar6 = *(long *)(lVar6 + lVar39);
      auVar84 = vunpcklps_avx(auVar65,auVar76);
      auVar64 = vunpckhps_avx(auVar65,auVar76);
      auVar65 = *(undefined1 (*) [16])(lVar6 + (ulong)uVar36 * 4);
      lVar8 = *(long *)(lVar8 + lVar39);
      auVar76 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
      auVar92 = vunpcklps_avx(auVar65,auVar76);
      auVar65 = vunpckhps_avx(auVar65,auVar76);
      auVar86 = vunpcklps_avx(auVar64,auVar65);
      auVar2 = vunpcklps_avx(auVar84,auVar92);
      auVar64 = vunpckhps_avx(auVar84,auVar92);
      auVar65 = *(undefined1 (*) [16])(lVar48 + uVar40 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar7 + uVar51 * 4);
      auVar92 = vunpcklps_avx(auVar65,auVar76);
      auVar84 = vunpckhps_avx(auVar65,auVar76);
      auVar65 = *(undefined1 (*) [16])(lVar6 + uVar44 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar8 + uVar49 * 4);
      auVar100 = vunpcklps_avx(auVar65,auVar76);
      auVar65 = vunpckhps_avx(auVar65,auVar76);
      auVar87 = vunpcklps_avx(auVar84,auVar65);
      auVar102 = vunpcklps_avx(auVar92,auVar100);
      auVar84 = vunpckhps_avx(auVar92,auVar100);
      auVar65 = *(undefined1 (*) [16])(lVar48 + uVar42 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar7 + uVar52 * 4);
      auVar100 = vunpcklps_avx(auVar65,auVar76);
      auVar92 = vunpckhps_avx(auVar65,auVar76);
      auVar65 = *(undefined1 (*) [16])(lVar6 + uVar45 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar8 + uVar50 * 4);
      auVar66 = vunpcklps_avx(auVar65,auVar76);
      auVar65 = vunpckhps_avx(auVar65,auVar76);
      auVar13 = vunpcklps_avx(auVar92,auVar65);
      auVar129 = vunpcklps_avx(auVar100,auVar66);
      auVar92 = vunpckhps_avx(auVar100,auVar66);
      auVar65 = *(undefined1 (*) [16])(lVar48 + uVar43 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar7 + uVar53 * 4);
      auVar66 = vunpcklps_avx(auVar65,auVar76);
      auVar100 = vunpckhps_avx(auVar65,auVar76);
      auVar65 = *(undefined1 (*) [16])(lVar6 + uVar46 * 4);
      auVar76 = *(undefined1 (*) [16])(lVar8 + uVar55 * 4);
      auVar93 = vunpcklps_avx(auVar65,auVar76);
      auVar65 = vunpckhps_avx(auVar65,auVar76);
      auVar76 = vunpcklps_avx(auVar100,auVar65);
      auVar100 = vunpcklps_avx(auVar66,auVar93);
      auVar65 = vunpckhps_avx(auVar66,auVar93);
      fVar155 = 1.0 - fVar141;
      auVar156._4_4_ = fVar155;
      auVar156._0_4_ = fVar155;
      auVar156._8_4_ = fVar155;
      auVar156._12_4_ = fVar155;
      auVar66._0_4_ = fVar141 * auVar2._0_4_;
      auVar66._4_4_ = fVar141 * auVar2._4_4_;
      auVar66._8_4_ = fVar141 * auVar2._8_4_;
      auVar66._12_4_ = fVar141 * auVar2._12_4_;
      auVar2 = vfmadd231ps_fma(auVar66,auVar156,local_1330);
      auVar111._0_4_ = fVar141 * auVar64._0_4_;
      auVar111._4_4_ = fVar141 * auVar64._4_4_;
      auVar111._8_4_ = fVar141 * auVar64._8_4_;
      auVar111._12_4_ = fVar141 * auVar64._12_4_;
      auVar64 = vfmadd231ps_fma(auVar111,auVar156,auVar85);
      auVar93._0_4_ = auVar86._0_4_ * fVar141;
      auVar93._4_4_ = auVar86._4_4_ * fVar141;
      auVar93._8_4_ = auVar86._8_4_ * fVar141;
      auVar93._12_4_ = auVar86._12_4_ * fVar141;
      auVar85 = vfmadd231ps_fma(auVar93,auVar156,auVar78);
      auVar163._0_4_ = fVar141 * auVar102._0_4_;
      auVar163._4_4_ = fVar141 * auVar102._4_4_;
      auVar163._8_4_ = fVar141 * auVar102._8_4_;
      auVar163._12_4_ = fVar141 * auVar102._12_4_;
      auVar86 = vfmadd231ps_fma(auVar163,auVar156,auVar59);
      auVar102._0_4_ = fVar141 * auVar84._0_4_;
      auVar102._4_4_ = fVar141 * auVar84._4_4_;
      auVar102._8_4_ = fVar141 * auVar84._8_4_;
      auVar102._12_4_ = fVar141 * auVar84._12_4_;
      auVar84 = vfmadd231ps_fma(auVar102,auVar156,auVar91);
      auVar78._0_4_ = auVar87._0_4_ * fVar141;
      auVar78._4_4_ = auVar87._4_4_ * fVar141;
      auVar78._8_4_ = auVar87._8_4_ * fVar141;
      auVar78._12_4_ = auVar87._12_4_ * fVar141;
      auVar91 = vfmadd231ps_fma(auVar78,auVar156,auVar77);
      auVar87._0_4_ = fVar141 * auVar129._0_4_;
      auVar87._4_4_ = fVar141 * auVar129._4_4_;
      auVar87._8_4_ = fVar141 * auVar129._8_4_;
      auVar87._12_4_ = fVar141 * auVar129._12_4_;
      auVar77 = vfmadd231ps_fma(auVar87,auVar156,auVar119);
      auVar129._0_4_ = auVar92._0_4_ * fVar141;
      auVar129._4_4_ = auVar92._4_4_ * fVar141;
      auVar129._8_4_ = auVar92._8_4_ * fVar141;
      auVar129._12_4_ = auVar92._12_4_ * fVar141;
      auVar92 = vfmadd231ps_fma(auVar129,auVar156,local_1360);
      auVar134._0_4_ = auVar13._0_4_ * fVar141;
      auVar134._4_4_ = auVar13._4_4_ * fVar141;
      auVar134._8_4_ = auVar13._8_4_ * fVar141;
      auVar134._12_4_ = auVar13._12_4_ * fVar141;
      auVar78 = vfmadd231ps_fma(auVar134,auVar156,auVar115);
      auVar115._0_4_ = fVar141 * auVar100._0_4_;
      auVar115._4_4_ = fVar141 * auVar100._4_4_;
      auVar115._8_4_ = fVar141 * auVar100._8_4_;
      auVar115._12_4_ = fVar141 * auVar100._12_4_;
      auVar119._0_4_ = auVar65._0_4_ * fVar141;
      auVar119._4_4_ = auVar65._4_4_ * fVar141;
      auVar119._8_4_ = auVar65._8_4_ * fVar141;
      auVar119._12_4_ = auVar65._12_4_ * fVar141;
      lVar6 = uVar33 + 0x40 + lVar34;
      local_10e0 = *(undefined8 *)(lVar6 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar6 + 0x18);
      auVar59._0_4_ = auVar76._0_4_ * fVar141;
      auVar59._4_4_ = auVar76._4_4_ * fVar141;
      auVar59._8_4_ = auVar76._8_4_ * fVar141;
      auVar59._12_4_ = auVar76._12_4_ * fVar141;
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      lVar34 = uVar33 + 0x50 + lVar34;
      local_1320 = *(undefined8 *)(lVar34 + 0x10);
      uStack_1318 = *(undefined8 *)(lVar34 + 0x18);
      auVar65 = vfmadd231ps_fma(auVar115,auVar156,local_1340);
      auVar76 = vfmadd231ps_fma(auVar119,auVar156,local_1350);
      auVar100 = vfmadd231ps_fma(auVar59,auVar156,auVar101);
      uStack_1310 = local_1320;
      uStack_1308 = uStack_1318;
      auVar69._16_16_ = auVar77;
      auVar69._0_16_ = auVar2;
      auVar88._16_16_ = auVar92;
      auVar88._0_16_ = auVar64;
      auVar94._16_16_ = auVar78;
      auVar94._0_16_ = auVar85;
      auVar130._16_16_ = auVar86;
      auVar130._0_16_ = auVar86;
      auVar103._16_16_ = auVar84;
      auVar103._0_16_ = auVar84;
      auVar79._16_16_ = auVar91;
      auVar79._0_16_ = auVar91;
      auVar164._16_16_ = auVar65;
      auVar164._0_16_ = auVar65;
      auVar120._16_16_ = auVar76;
      auVar120._0_16_ = auVar76;
      uVar143 = *(undefined4 *)(ray + k * 4);
      auVar139._4_4_ = uVar143;
      auVar139._0_4_ = uVar143;
      auVar139._8_4_ = uVar143;
      auVar139._12_4_ = uVar143;
      auVar139._16_4_ = uVar143;
      auVar139._20_4_ = uVar143;
      auVar139._24_4_ = uVar143;
      auVar139._28_4_ = uVar143;
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar144._4_4_ = uVar143;
      auVar144._0_4_ = uVar143;
      auVar144._8_4_ = uVar143;
      auVar144._12_4_ = uVar143;
      auVar144._16_4_ = uVar143;
      auVar144._20_4_ = uVar143;
      auVar144._24_4_ = uVar143;
      auVar144._28_4_ = uVar143;
      auVar60._16_16_ = auVar100;
      auVar60._0_16_ = auVar100;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar157._4_4_ = uVar1;
      auVar157._0_4_ = uVar1;
      auVar157._8_4_ = uVar1;
      auVar157._12_4_ = uVar1;
      auVar157._16_4_ = uVar1;
      auVar157._20_4_ = uVar1;
      auVar157._24_4_ = uVar1;
      auVar157._28_4_ = uVar1;
      auVar69 = vsubps_avx(auVar69,auVar139);
      local_15a0 = vsubps_avx(auVar88,auVar144);
      local_1440 = vsubps_avx(auVar94,auVar157);
      auVar67 = vsubps_avx(auVar130,auVar139);
      auVar68 = vsubps_avx(auVar103,auVar144);
      auVar73 = vsubps_avx(auVar79,auVar157);
      auVar79 = vsubps_avx(auVar164,auVar139);
      auVar88 = vsubps_avx(auVar120,auVar144);
      auVar10 = vsubps_avx(auVar60,auVar157);
      local_1460 = vsubps_avx(auVar79,auVar69);
      local_14a0 = vsubps_avx(auVar88,local_15a0);
      local_1480 = vsubps_avx(auVar10,local_1440);
      auVar61._0_4_ = auVar69._0_4_ + auVar79._0_4_;
      auVar61._4_4_ = auVar69._4_4_ + auVar79._4_4_;
      auVar61._8_4_ = auVar69._8_4_ + auVar79._8_4_;
      auVar61._12_4_ = auVar69._12_4_ + auVar79._12_4_;
      auVar61._16_4_ = auVar69._16_4_ + auVar79._16_4_;
      auVar61._20_4_ = auVar69._20_4_ + auVar79._20_4_;
      auVar61._24_4_ = auVar69._24_4_ + auVar79._24_4_;
      auVar61._28_4_ = auVar69._28_4_ + auVar79._28_4_;
      auVar80._0_4_ = auVar88._0_4_ + local_15a0._0_4_;
      auVar80._4_4_ = auVar88._4_4_ + local_15a0._4_4_;
      auVar80._8_4_ = auVar88._8_4_ + local_15a0._8_4_;
      auVar80._12_4_ = auVar88._12_4_ + local_15a0._12_4_;
      auVar80._16_4_ = auVar88._16_4_ + local_15a0._16_4_;
      auVar80._20_4_ = auVar88._20_4_ + local_15a0._20_4_;
      auVar80._24_4_ = auVar88._24_4_ + local_15a0._24_4_;
      fVar99 = local_15a0._28_4_;
      auVar80._28_4_ = auVar88._28_4_ + fVar99;
      fVar155 = local_1440._0_4_;
      auVar95._0_4_ = auVar10._0_4_ + fVar155;
      fVar162 = local_1440._4_4_;
      auVar95._4_4_ = auVar10._4_4_ + fVar162;
      fVar133 = local_1440._8_4_;
      auVar95._8_4_ = auVar10._8_4_ + fVar133;
      fVar138 = local_1440._12_4_;
      auVar95._12_4_ = auVar10._12_4_ + fVar138;
      fVar140 = local_1440._16_4_;
      auVar95._16_4_ = auVar10._16_4_ + fVar140;
      fVar136 = local_1440._20_4_;
      auVar95._20_4_ = auVar10._20_4_ + fVar136;
      fVar137 = local_1440._24_4_;
      auVar95._24_4_ = auVar10._24_4_ + fVar137;
      auVar95._28_4_ = auVar10._28_4_ + local_1440._28_4_;
      auVar11._4_4_ = local_1480._4_4_ * auVar80._4_4_;
      auVar11._0_4_ = local_1480._0_4_ * auVar80._0_4_;
      auVar11._8_4_ = local_1480._8_4_ * auVar80._8_4_;
      auVar11._12_4_ = local_1480._12_4_ * auVar80._12_4_;
      auVar11._16_4_ = local_1480._16_4_ * auVar80._16_4_;
      auVar11._20_4_ = local_1480._20_4_ * auVar80._20_4_;
      auVar11._24_4_ = local_1480._24_4_ * auVar80._24_4_;
      auVar11._28_4_ = uVar143;
      auVar76 = vfmsub231ps_fma(auVar11,local_14a0,auVar95);
      auVar12._4_4_ = local_1460._4_4_ * auVar95._4_4_;
      auVar12._0_4_ = local_1460._0_4_ * auVar95._0_4_;
      auVar12._8_4_ = local_1460._8_4_ * auVar95._8_4_;
      auVar12._12_4_ = local_1460._12_4_ * auVar95._12_4_;
      auVar12._16_4_ = local_1460._16_4_ * auVar95._16_4_;
      auVar12._20_4_ = local_1460._20_4_ * auVar95._20_4_;
      auVar12._24_4_ = local_1460._24_4_ * auVar95._24_4_;
      auVar12._28_4_ = auVar95._28_4_;
      auVar65 = vfmsub231ps_fma(auVar12,local_1480,auVar61);
      auVar14._4_4_ = local_14a0._4_4_ * auVar61._4_4_;
      auVar14._0_4_ = local_14a0._0_4_ * auVar61._0_4_;
      auVar14._8_4_ = local_14a0._8_4_ * auVar61._8_4_;
      auVar14._12_4_ = local_14a0._12_4_ * auVar61._12_4_;
      auVar14._16_4_ = local_14a0._16_4_ * auVar61._16_4_;
      auVar14._20_4_ = local_14a0._20_4_ * auVar61._20_4_;
      auVar14._24_4_ = local_14a0._24_4_ * auVar61._24_4_;
      auVar14._28_4_ = auVar61._28_4_;
      auVar64 = vfmsub231ps_fma(auVar14,local_1460,auVar80);
      uVar143 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar158._4_4_ = uVar143;
      auVar158._0_4_ = uVar143;
      auVar158._8_4_ = uVar143;
      auVar158._12_4_ = uVar143;
      auVar158._16_4_ = uVar143;
      auVar158._20_4_ = uVar143;
      auVar158._24_4_ = uVar143;
      auVar158._28_4_ = uVar143;
      fVar141 = *(float *)(ray + k * 4 + 0xc0);
      auVar15._4_4_ = fVar141 * auVar64._4_4_;
      auVar15._0_4_ = fVar141 * auVar64._0_4_;
      auVar15._8_4_ = fVar141 * auVar64._8_4_;
      auVar15._12_4_ = fVar141 * auVar64._12_4_;
      auVar15._16_4_ = fVar141 * 0.0;
      auVar15._20_4_ = fVar141 * 0.0;
      auVar15._24_4_ = fVar141 * 0.0;
      auVar15._28_4_ = local_1480._28_4_;
      auVar65 = vfmadd231ps_fma(auVar15,auVar158,ZEXT1632(auVar65));
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar116._4_4_ = uVar143;
      auVar116._0_4_ = uVar143;
      auVar116._8_4_ = uVar143;
      auVar116._12_4_ = uVar143;
      auVar116._16_4_ = uVar143;
      auVar116._20_4_ = uVar143;
      auVar116._24_4_ = uVar143;
      auVar116._28_4_ = uVar143;
      local_1300 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar116,ZEXT1632(auVar76));
      local_14c0 = vsubps_avx(local_15a0,auVar68);
      local_14e0 = vsubps_avx(local_1440,auVar73);
      auVar81._0_4_ = auVar68._0_4_ + local_15a0._0_4_;
      auVar81._4_4_ = auVar68._4_4_ + local_15a0._4_4_;
      auVar81._8_4_ = auVar68._8_4_ + local_15a0._8_4_;
      auVar81._12_4_ = auVar68._12_4_ + local_15a0._12_4_;
      auVar81._16_4_ = auVar68._16_4_ + local_15a0._16_4_;
      auVar81._20_4_ = auVar68._20_4_ + local_15a0._20_4_;
      auVar81._24_4_ = auVar68._24_4_ + local_15a0._24_4_;
      auVar81._28_4_ = auVar68._28_4_ + fVar99;
      auVar96._0_4_ = fVar155 + auVar73._0_4_;
      auVar96._4_4_ = fVar162 + auVar73._4_4_;
      auVar96._8_4_ = fVar133 + auVar73._8_4_;
      auVar96._12_4_ = fVar138 + auVar73._12_4_;
      auVar96._16_4_ = fVar140 + auVar73._16_4_;
      auVar96._20_4_ = fVar136 + auVar73._20_4_;
      auVar96._24_4_ = fVar137 + auVar73._24_4_;
      auVar96._28_4_ = local_1440._28_4_ + auVar73._28_4_;
      fVar142 = local_14e0._0_4_;
      fVar147 = local_14e0._4_4_;
      auVar16._4_4_ = fVar147 * auVar81._4_4_;
      auVar16._0_4_ = fVar142 * auVar81._0_4_;
      fVar149 = local_14e0._8_4_;
      auVar16._8_4_ = fVar149 * auVar81._8_4_;
      fVar151 = local_14e0._12_4_;
      auVar16._12_4_ = fVar151 * auVar81._12_4_;
      fVar152 = local_14e0._16_4_;
      auVar16._16_4_ = fVar152 * auVar81._16_4_;
      fVar153 = local_14e0._20_4_;
      auVar16._20_4_ = fVar153 * auVar81._20_4_;
      fVar154 = local_14e0._24_4_;
      auVar16._24_4_ = fVar154 * auVar81._24_4_;
      auVar16._28_4_ = fVar99;
      auVar76 = vfmsub231ps_fma(auVar16,local_14c0,auVar96);
      auVar11 = vsubps_avx(auVar69,auVar67);
      fVar99 = auVar11._0_4_;
      fVar106 = auVar11._4_4_;
      auVar17._4_4_ = auVar96._4_4_ * fVar106;
      auVar17._0_4_ = auVar96._0_4_ * fVar99;
      fVar108 = auVar11._8_4_;
      auVar17._8_4_ = auVar96._8_4_ * fVar108;
      fVar110 = auVar11._12_4_;
      auVar17._12_4_ = auVar96._12_4_ * fVar110;
      fVar148 = auVar11._16_4_;
      auVar17._16_4_ = auVar96._16_4_ * fVar148;
      fVar159 = auVar11._20_4_;
      auVar17._20_4_ = auVar96._20_4_ * fVar159;
      fVar161 = auVar11._24_4_;
      auVar17._24_4_ = auVar96._24_4_ * fVar161;
      auVar17._28_4_ = auVar96._28_4_;
      auVar121._0_4_ = auVar69._0_4_ + auVar67._0_4_;
      auVar121._4_4_ = auVar69._4_4_ + auVar67._4_4_;
      auVar121._8_4_ = auVar69._8_4_ + auVar67._8_4_;
      auVar121._12_4_ = auVar69._12_4_ + auVar67._12_4_;
      auVar121._16_4_ = auVar69._16_4_ + auVar67._16_4_;
      auVar121._20_4_ = auVar69._20_4_ + auVar67._20_4_;
      auVar121._24_4_ = auVar69._24_4_ + auVar67._24_4_;
      auVar121._28_4_ = auVar69._28_4_ + auVar67._28_4_;
      auVar65 = vfmsub231ps_fma(auVar17,local_14e0,auVar121);
      fVar105 = local_14c0._0_4_;
      fVar107 = local_14c0._4_4_;
      auVar18._4_4_ = auVar121._4_4_ * fVar107;
      auVar18._0_4_ = auVar121._0_4_ * fVar105;
      fVar109 = local_14c0._8_4_;
      auVar18._8_4_ = auVar121._8_4_ * fVar109;
      fVar146 = local_14c0._12_4_;
      auVar18._12_4_ = auVar121._12_4_ * fVar146;
      fVar150 = local_14c0._16_4_;
      auVar18._16_4_ = auVar121._16_4_ * fVar150;
      fVar160 = local_14c0._20_4_;
      auVar18._20_4_ = auVar121._20_4_ * fVar160;
      fVar165 = local_14c0._24_4_;
      auVar18._24_4_ = auVar121._24_4_ * fVar165;
      auVar18._28_4_ = auVar121._28_4_;
      auVar64 = vfmsub231ps_fma(auVar18,auVar11,auVar81);
      auVar19._4_4_ = auVar64._4_4_ * fVar141;
      auVar19._0_4_ = auVar64._0_4_ * fVar141;
      auVar19._8_4_ = auVar64._8_4_ * fVar141;
      auVar19._12_4_ = auVar64._12_4_ * fVar141;
      auVar19._16_4_ = fVar141 * 0.0;
      auVar19._20_4_ = fVar141 * 0.0;
      auVar19._24_4_ = fVar141 * 0.0;
      auVar19._28_4_ = auVar81._28_4_;
      auVar65 = vfmadd231ps_fma(auVar19,auVar158,ZEXT1632(auVar65));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar116,ZEXT1632(auVar76));
      auVar12 = vsubps_avx(auVar67,auVar79);
      auVar89._0_4_ = auVar67._0_4_ + auVar79._0_4_;
      auVar89._4_4_ = auVar67._4_4_ + auVar79._4_4_;
      auVar89._8_4_ = auVar67._8_4_ + auVar79._8_4_;
      auVar89._12_4_ = auVar67._12_4_ + auVar79._12_4_;
      auVar89._16_4_ = auVar67._16_4_ + auVar79._16_4_;
      auVar89._20_4_ = auVar67._20_4_ + auVar79._20_4_;
      auVar89._24_4_ = auVar67._24_4_ + auVar79._24_4_;
      auVar89._28_4_ = auVar67._28_4_ + auVar79._28_4_;
      auVar79 = vsubps_avx(auVar68,auVar88);
      auVar104._0_4_ = auVar68._0_4_ + auVar88._0_4_;
      auVar104._4_4_ = auVar68._4_4_ + auVar88._4_4_;
      auVar104._8_4_ = auVar68._8_4_ + auVar88._8_4_;
      auVar104._12_4_ = auVar68._12_4_ + auVar88._12_4_;
      auVar104._16_4_ = auVar68._16_4_ + auVar88._16_4_;
      auVar104._20_4_ = auVar68._20_4_ + auVar88._20_4_;
      auVar104._24_4_ = auVar68._24_4_ + auVar88._24_4_;
      auVar104._28_4_ = auVar68._28_4_ + auVar88._28_4_;
      auVar88 = vsubps_avx(auVar73,auVar10);
      auVar70._0_4_ = auVar73._0_4_ + auVar10._0_4_;
      auVar70._4_4_ = auVar73._4_4_ + auVar10._4_4_;
      auVar70._8_4_ = auVar73._8_4_ + auVar10._8_4_;
      auVar70._12_4_ = auVar73._12_4_ + auVar10._12_4_;
      auVar70._16_4_ = auVar73._16_4_ + auVar10._16_4_;
      auVar70._20_4_ = auVar73._20_4_ + auVar10._20_4_;
      auVar70._24_4_ = auVar73._24_4_ + auVar10._24_4_;
      auVar70._28_4_ = auVar73._28_4_ + auVar10._28_4_;
      auVar112._0_4_ = auVar88._0_4_ * auVar104._0_4_;
      auVar112._4_4_ = auVar88._4_4_ * auVar104._4_4_;
      auVar112._8_4_ = auVar88._8_4_ * auVar104._8_4_;
      auVar112._12_4_ = auVar88._12_4_ * auVar104._12_4_;
      auVar112._16_4_ = auVar88._16_4_ * auVar104._16_4_;
      auVar112._20_4_ = auVar88._20_4_ * auVar104._20_4_;
      auVar112._24_4_ = auVar88._24_4_ * auVar104._24_4_;
      auVar112._28_4_ = 0;
      auVar64 = vfmsub231ps_fma(auVar112,auVar79,auVar70);
      auVar10._4_4_ = auVar70._4_4_ * auVar12._4_4_;
      auVar10._0_4_ = auVar70._0_4_ * auVar12._0_4_;
      auVar10._8_4_ = auVar70._8_4_ * auVar12._8_4_;
      auVar10._12_4_ = auVar70._12_4_ * auVar12._12_4_;
      auVar10._16_4_ = auVar70._16_4_ * auVar12._16_4_;
      auVar10._20_4_ = auVar70._20_4_ * auVar12._20_4_;
      auVar10._24_4_ = auVar70._24_4_ * auVar12._24_4_;
      auVar10._28_4_ = auVar70._28_4_;
      auVar76 = vfmsub231ps_fma(auVar10,auVar88,auVar89);
      auVar20._4_4_ = auVar79._4_4_ * auVar89._4_4_;
      auVar20._0_4_ = auVar79._0_4_ * auVar89._0_4_;
      auVar20._8_4_ = auVar79._8_4_ * auVar89._8_4_;
      auVar20._12_4_ = auVar79._12_4_ * auVar89._12_4_;
      auVar20._16_4_ = auVar79._16_4_ * auVar89._16_4_;
      auVar20._20_4_ = auVar79._20_4_ * auVar89._20_4_;
      auVar20._24_4_ = auVar79._24_4_ * auVar89._24_4_;
      auVar20._28_4_ = auVar89._28_4_;
      auVar84 = vfmsub231ps_fma(auVar20,auVar12,auVar104);
      auVar90._0_4_ = fVar141 * auVar84._0_4_;
      auVar90._4_4_ = fVar141 * auVar84._4_4_;
      auVar90._8_4_ = fVar141 * auVar84._8_4_;
      auVar90._12_4_ = fVar141 * auVar84._12_4_;
      auVar90._16_4_ = fVar141 * 0.0;
      auVar90._20_4_ = fVar141 * 0.0;
      auVar90._24_4_ = fVar141 * 0.0;
      auVar90._28_4_ = 0;
      auVar76 = vfmadd231ps_fma(auVar90,auVar158,ZEXT1632(auVar76));
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar116,ZEXT1632(auVar64));
      local_12c0 = ZEXT1632(CONCAT412(auVar76._12_4_ + local_1300._12_4_ + auVar65._12_4_,
                                      CONCAT48(auVar76._8_4_ + local_1300._8_4_ + auVar65._8_4_,
                                               CONCAT44(auVar76._4_4_ +
                                                        local_1300._4_4_ + auVar65._4_4_,
                                                        auVar76._0_4_ +
                                                        local_1300._0_4_ + auVar65._0_4_))));
      auVar71._8_4_ = 0x7fffffff;
      auVar71._0_8_ = 0x7fffffff7fffffff;
      auVar71._12_4_ = 0x7fffffff;
      auVar71._16_4_ = 0x7fffffff;
      auVar71._20_4_ = 0x7fffffff;
      auVar71._24_4_ = 0x7fffffff;
      auVar71._28_4_ = 0x7fffffff;
      local_1520 = ZEXT1632(local_1300);
      auVar67 = vminps_avx(local_1520,ZEXT1632(auVar65));
      auVar67 = vminps_avx(auVar67,ZEXT1632(auVar76));
      local_1540 = vandps_avx(local_12c0,auVar71);
      fVar118 = local_1540._0_4_ * 1.1920929e-07;
      fVar123 = local_1540._4_4_ * 1.1920929e-07;
      auVar21._4_4_ = fVar123;
      auVar21._0_4_ = fVar118;
      fVar124 = local_1540._8_4_ * 1.1920929e-07;
      auVar21._8_4_ = fVar124;
      fVar125 = local_1540._12_4_ * 1.1920929e-07;
      auVar21._12_4_ = fVar125;
      fVar126 = local_1540._16_4_ * 1.1920929e-07;
      auVar21._16_4_ = fVar126;
      fVar127 = local_1540._20_4_ * 1.1920929e-07;
      auVar21._20_4_ = fVar127;
      fVar128 = local_1540._24_4_ * 1.1920929e-07;
      auVar21._24_4_ = fVar128;
      auVar21._28_4_ = 0x34000000;
      auVar113._0_8_ = CONCAT44(fVar123,fVar118) ^ 0x8000000080000000;
      auVar113._8_4_ = -fVar124;
      auVar113._12_4_ = -fVar125;
      auVar113._16_4_ = -fVar126;
      auVar113._20_4_ = -fVar127;
      auVar113._24_4_ = -fVar128;
      auVar113._28_4_ = 0xb4000000;
      auVar67 = vcmpps_avx(auVar67,auVar113,5);
      auVar73 = vmaxps_avx(local_1520,ZEXT1632(auVar65));
      auVar68 = vmaxps_avx(auVar73,ZEXT1632(auVar76));
      auVar68 = vcmpps_avx(auVar68,auVar21,2);
      auVar68 = vorps_avx(auVar67,auVar68);
      if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar68 >> 0x7f,0) != '\0') ||
            (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar68 >> 0xbf,0) != '\0') ||
          (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar68[0x1f] < '\0') {
        auVar22._4_4_ = fVar107 * local_1480._4_4_;
        auVar22._0_4_ = fVar105 * local_1480._0_4_;
        auVar22._8_4_ = fVar109 * local_1480._8_4_;
        auVar22._12_4_ = fVar146 * local_1480._12_4_;
        auVar22._16_4_ = fVar150 * local_1480._16_4_;
        auVar22._20_4_ = fVar160 * local_1480._20_4_;
        auVar22._24_4_ = fVar165 * local_1480._24_4_;
        auVar22._28_4_ = auVar67._28_4_;
        local_1500 = fVar99 * local_14a0._0_4_;
        fStack_14fc = fVar106 * local_14a0._4_4_;
        fStack_14f8 = fVar108 * local_14a0._8_4_;
        fStack_14f4 = fVar110 * local_14a0._12_4_;
        fStack_14f0 = fVar148 * local_14a0._16_4_;
        fStack_14ec = fVar159 * local_14a0._20_4_;
        uStack_14e4 = auVar73._28_4_;
        fStack_14e8 = fVar161 * local_14a0._24_4_;
        auVar76 = vfmsub213ps_fma(local_14a0,local_14e0,auVar22);
        auVar23._4_4_ = auVar79._4_4_ * fVar147;
        auVar23._0_4_ = auVar79._0_4_ * fVar142;
        auVar23._8_4_ = auVar79._8_4_ * fVar149;
        auVar23._12_4_ = auVar79._12_4_ * fVar151;
        auVar23._16_4_ = auVar79._16_4_ * fVar152;
        auVar23._20_4_ = auVar79._20_4_ * fVar153;
        auVar23._24_4_ = auVar79._24_4_ * fVar154;
        auVar23._28_4_ = uStack_14e4;
        auVar24._4_4_ = auVar88._4_4_ * fVar106;
        auVar24._0_4_ = auVar88._0_4_ * fVar99;
        auVar24._8_4_ = auVar88._8_4_ * fVar108;
        auVar24._12_4_ = auVar88._12_4_ * fVar110;
        auVar24._16_4_ = auVar88._16_4_ * fVar148;
        auVar24._20_4_ = auVar88._20_4_ * fVar159;
        auVar24._24_4_ = auVar88._24_4_ * fVar161;
        auVar24._28_4_ = local_1540._28_4_;
        auVar64 = vfmsub213ps_fma(auVar88,local_14c0,auVar23);
        auVar67 = vandps_avx(auVar22,auVar71);
        auVar73 = vandps_avx(auVar23,auVar71);
        auVar67 = vcmpps_avx(auVar67,auVar73,1);
        local_12a0 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar76),auVar67);
        auVar25._4_4_ = fVar107 * auVar12._4_4_;
        auVar25._0_4_ = fVar105 * auVar12._0_4_;
        auVar25._8_4_ = fVar109 * auVar12._8_4_;
        auVar25._12_4_ = fVar146 * auVar12._12_4_;
        auVar25._16_4_ = fVar150 * auVar12._16_4_;
        auVar25._20_4_ = fVar160 * auVar12._20_4_;
        auVar25._24_4_ = fVar165 * auVar12._24_4_;
        auVar25._28_4_ = auVar67._28_4_;
        auVar76 = vfmsub213ps_fma(auVar12,local_14e0,auVar24);
        auVar26._4_4_ = local_1460._4_4_ * fVar147;
        auVar26._0_4_ = local_1460._0_4_ * fVar142;
        auVar26._8_4_ = local_1460._8_4_ * fVar149;
        auVar26._12_4_ = local_1460._12_4_ * fVar151;
        auVar26._16_4_ = local_1460._16_4_ * fVar152;
        auVar26._20_4_ = local_1460._20_4_ * fVar153;
        auVar26._24_4_ = local_1460._24_4_ * fVar154;
        auVar26._28_4_ = auVar73._28_4_;
        auVar64 = vfmsub213ps_fma(local_1480,auVar11,auVar26);
        auVar67 = vandps_avx(auVar26,auVar71);
        auVar73 = vandps_avx(auVar24,auVar71);
        auVar67 = vcmpps_avx(auVar67,auVar73,1);
        local_1280 = vblendvps_avx(ZEXT1632(auVar76),ZEXT1632(auVar64),auVar67);
        auVar29._4_4_ = fStack_14fc;
        auVar29._0_4_ = local_1500;
        auVar29._8_4_ = fStack_14f8;
        auVar29._12_4_ = fStack_14f4;
        auVar29._16_4_ = fStack_14f0;
        auVar29._20_4_ = fStack_14ec;
        auVar29._24_4_ = fStack_14e8;
        auVar29._28_4_ = uStack_14e4;
        auVar76 = vfmsub213ps_fma(local_1460,local_14c0,auVar29);
        auVar64 = vfmsub213ps_fma(auVar79,auVar11,auVar25);
        auVar67 = vandps_avx(auVar29,auVar71);
        auVar73 = vandps_avx(auVar25,auVar71);
        auVar73 = vcmpps_avx(auVar67,auVar73,1);
        local_1260 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar76),auVar73);
        auVar76 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
        fVar99 = local_1260._0_4_;
        auVar72._0_4_ = fVar99 * fVar141;
        fVar105 = local_1260._4_4_;
        auVar72._4_4_ = fVar105 * fVar141;
        fVar106 = local_1260._8_4_;
        auVar72._8_4_ = fVar106 * fVar141;
        fVar107 = local_1260._12_4_;
        auVar72._12_4_ = fVar107 * fVar141;
        fVar108 = local_1260._16_4_;
        auVar72._16_4_ = fVar108 * fVar141;
        fVar109 = local_1260._20_4_;
        auVar72._20_4_ = fVar109 * fVar141;
        fVar110 = local_1260._24_4_;
        auVar72._24_4_ = fVar110 * fVar141;
        auVar72._28_4_ = 0;
        auVar64 = vfmadd213ps_fma(auVar158,local_1280,auVar72);
        auVar64 = vfmadd213ps_fma(auVar116,local_12a0,ZEXT1632(auVar64));
        auVar73 = ZEXT1632(CONCAT412(auVar64._12_4_ + auVar64._12_4_,
                                     CONCAT48(auVar64._8_4_ + auVar64._8_4_,
                                              CONCAT44(auVar64._4_4_ + auVar64._4_4_,
                                                       auVar64._0_4_ + auVar64._0_4_))));
        auVar27._4_4_ = fVar105 * fVar162;
        auVar27._0_4_ = fVar99 * fVar155;
        auVar27._8_4_ = fVar106 * fVar133;
        auVar27._12_4_ = fVar107 * fVar138;
        auVar27._16_4_ = fVar108 * fVar140;
        auVar27._20_4_ = fVar109 * fVar136;
        auVar27._24_4_ = fVar110 * fVar137;
        auVar27._28_4_ = auVar67._28_4_;
        auVar64 = vfmadd213ps_fma(local_15a0,local_1280,auVar27);
        auVar84 = vfmadd213ps_fma(auVar69,local_12a0,ZEXT1632(auVar64));
        auVar67 = vrcpps_avx(auVar73);
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = 0x3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar135._16_4_ = 0x3f800000;
        auVar135._20_4_ = 0x3f800000;
        auVar135._24_4_ = 0x3f800000;
        auVar135._28_4_ = 0x3f800000;
        auVar64 = vfnmadd213ps_fma(auVar67,auVar73,auVar135);
        auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar67,auVar67);
        local_11e0._28_4_ = 0x3f800000;
        local_11e0._0_28_ =
             ZEXT1628(CONCAT412(auVar64._12_4_ * (auVar84._12_4_ + auVar84._12_4_),
                                CONCAT48(auVar64._8_4_ * (auVar84._8_4_ + auVar84._8_4_),
                                         CONCAT44(auVar64._4_4_ * (auVar84._4_4_ + auVar84._4_4_),
                                                  auVar64._0_4_ * (auVar84._0_4_ + auVar84._0_4_))))
                     );
        auVar63 = ZEXT3264(local_11e0);
        uVar143 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar97._4_4_ = uVar143;
        auVar97._0_4_ = uVar143;
        auVar97._8_4_ = uVar143;
        auVar97._12_4_ = uVar143;
        auVar97._16_4_ = uVar143;
        auVar97._20_4_ = uVar143;
        auVar97._24_4_ = uVar143;
        auVar97._28_4_ = uVar143;
        uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar145._4_4_ = uVar143;
        auVar145._0_4_ = uVar143;
        auVar145._8_4_ = uVar143;
        auVar145._12_4_ = uVar143;
        auVar145._16_4_ = uVar143;
        auVar145._20_4_ = uVar143;
        auVar145._24_4_ = uVar143;
        auVar145._28_4_ = uVar143;
        auVar114 = ZEXT3264(auVar145);
        auVar67 = vcmpps_avx(auVar97,local_11e0,2);
        auVar68 = vcmpps_avx(local_11e0,auVar145,2);
        auVar67 = vandps_avx(auVar68,auVar67);
        auVar64 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
        auVar76 = vpand_avx(auVar64,auVar76);
        auVar67 = vpmovsxwd_avx2(auVar76);
        if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0x7f,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar67 >> 0xbf,0) != '\0') ||
            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar67[0x1f] < '\0') {
          auVar67 = vcmpps_avx(auVar73,_DAT_01f7b000,4);
          auVar64 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
          auVar76 = vpand_avx(auVar76,auVar64);
          local_1580 = vpmovsxwd_avx2(auVar76);
          if ((((((((local_1580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1580 >> 0x7f,0) != '\0') ||
                (local_1580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_1580 >> 0xbf,0) != '\0') ||
              (local_1580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_1580[0x1f] < '\0') {
            uStack_12f0 = 0;
            uStack_12ec = 0;
            uStack_12e8 = 0;
            uStack_12e4 = 0;
            local_12e0 = ZEXT1632(auVar65);
            local_1240 = local_1580;
            local_1160 = local_1100;
            auVar67 = vrcpps_avx(local_12c0);
            auVar131._8_4_ = 0x3f800000;
            auVar131._0_8_ = 0x3f8000003f800000;
            auVar131._12_4_ = 0x3f800000;
            auVar131._16_4_ = 0x3f800000;
            auVar131._20_4_ = 0x3f800000;
            auVar131._24_4_ = 0x3f800000;
            auVar131._28_4_ = 0x3f800000;
            auVar64 = vfnmadd213ps_fma(local_12c0,auVar67,auVar131);
            auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar67,auVar67);
            auVar98._8_4_ = 0x219392ef;
            auVar98._0_8_ = 0x219392ef219392ef;
            auVar98._12_4_ = 0x219392ef;
            auVar98._16_4_ = 0x219392ef;
            auVar98._20_4_ = 0x219392ef;
            auVar98._24_4_ = 0x219392ef;
            auVar98._28_4_ = 0x219392ef;
            auVar67 = vcmpps_avx(local_1540,auVar98,5);
            auVar67 = vandps_avx(auVar67,ZEXT1632(auVar64));
            auVar28._4_4_ = local_1300._4_4_ * auVar67._4_4_;
            auVar28._0_4_ = local_1300._0_4_ * auVar67._0_4_;
            auVar28._8_4_ = local_1300._8_4_ * auVar67._8_4_;
            auVar28._12_4_ = local_1300._12_4_ * auVar67._12_4_;
            auVar28._16_4_ = auVar67._16_4_ * 0.0;
            auVar28._20_4_ = auVar67._20_4_ * 0.0;
            auVar28._24_4_ = auVar67._24_4_ * 0.0;
            auVar28._28_4_ = 0;
            auVar68 = vminps_avx(auVar28,auVar131);
            auVar82._0_4_ = auVar65._0_4_ * auVar67._0_4_;
            auVar82._4_4_ = auVar65._4_4_ * auVar67._4_4_;
            auVar82._8_4_ = auVar65._8_4_ * auVar67._8_4_;
            auVar82._12_4_ = auVar65._12_4_ * auVar67._12_4_;
            auVar82._16_4_ = auVar67._16_4_ * 0.0;
            auVar82._20_4_ = auVar67._20_4_ * 0.0;
            auVar82._24_4_ = auVar67._24_4_ * 0.0;
            auVar82._28_4_ = 0;
            auVar67 = vminps_avx(auVar82,auVar131);
            auVar73 = vsubps_avx(auVar131,auVar68);
            auVar69 = vsubps_avx(auVar131,auVar67);
            local_1200 = vblendvps_avx(auVar67,auVar73,local_1100);
            local_1220 = vblendvps_avx(auVar68,auVar69,local_1100);
            local_11c0[0] = local_12a0._0_4_ * (float)local_1120._0_4_;
            local_11c0[1] = local_12a0._4_4_ * (float)local_1120._4_4_;
            local_11c0[2] = local_12a0._8_4_ * fStack_1118;
            local_11c0[3] = local_12a0._12_4_ * fStack_1114;
            fStack_11b0 = local_12a0._16_4_ * fStack_1110;
            fStack_11ac = local_12a0._20_4_ * fStack_110c;
            fStack_11a8 = local_12a0._24_4_ * fStack_1108;
            uStack_11a4 = local_1220._28_4_;
            local_11a0[0] = (float)local_1120._0_4_ * local_1280._0_4_;
            local_11a0[1] = (float)local_1120._4_4_ * local_1280._4_4_;
            local_11a0[2] = fStack_1118 * local_1280._8_4_;
            local_11a0[3] = fStack_1114 * local_1280._12_4_;
            fStack_1190 = fStack_1110 * local_1280._16_4_;
            fStack_118c = fStack_110c * local_1280._20_4_;
            fStack_1188 = fStack_1108 * local_1280._24_4_;
            uStack_1184 = local_1200._28_4_;
            local_1180[0] = (float)local_1120._0_4_ * fVar99;
            local_1180[1] = (float)local_1120._4_4_ * fVar105;
            local_1180[2] = fStack_1118 * fVar106;
            local_1180[3] = fStack_1114 * fVar107;
            fStack_1170 = fStack_1110 * fVar108;
            fStack_116c = fStack_110c * fVar109;
            fStack_1168 = fStack_1108 * fVar110;
            uStack_1164 = uStack_1104;
            auVar67 = vpmovsxwd_avx2(auVar76);
            auVar83._8_4_ = 0x7f800000;
            auVar83._0_8_ = 0x7f8000007f800000;
            auVar83._12_4_ = 0x7f800000;
            auVar83._16_4_ = 0x7f800000;
            auVar83._20_4_ = 0x7f800000;
            auVar83._24_4_ = 0x7f800000;
            auVar83._28_4_ = 0x7f800000;
            auVar67 = vblendvps_avx(auVar83,local_11e0,auVar67);
            auVar68 = vshufps_avx(auVar67,auVar67,0xb1);
            auVar68 = vminps_avx(auVar67,auVar68);
            auVar73 = vshufpd_avx(auVar68,auVar68,5);
            auVar68 = vminps_avx(auVar68,auVar73);
            auVar73 = vpermpd_avx2(auVar68,0x4e);
            auVar68 = vminps_avx(auVar68,auVar73);
            auVar67 = vcmpps_avx(auVar67,auVar68,0);
            auVar65 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
            auVar65 = vpand_avx(auVar65,auVar76);
            auVar67 = vpmovsxwd_avx2(auVar65);
            if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar67 >> 0x7f,0) == '\0') &&
                  (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar67 >> 0xbf,0) == '\0') &&
                (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar67[0x1f]) {
              auVar67 = local_1580;
            }
            auVar117 = ZEXT3264(auVar67);
            auVar67 = vpcmpeqd_avx2(auVar69,auVar69);
            auVar122 = ZEXT3264(auVar67);
LAB_0160ef02:
            uVar32 = vmovmskps_avx(auVar117._0_32_);
            uVar36 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
              uVar36 = uVar36 + 1;
            }
            uVar37 = (ulong)uVar36;
            uVar32 = *(uint *)((long)&local_10e0 + uVar37 * 4);
            pGVar56 = (pSVar4->geometries).items[uVar32].ptr;
            if ((pGVar56->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1580 + uVar37 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar37 = (ulong)(uVar36 << 2);
                uVar143 = *(undefined4 *)(local_1220 + uVar37);
                uVar1 = *(undefined4 *)(local_1200 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)local_11c0 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_11a0 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_1180 + uVar37);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar143;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_1320 + uVar37);
                *(uint *)(ray + k * 4 + 0x240) = uVar32;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_0160f35f;
              }
              uVar40 = (ulong)(uVar36 * 4);
              local_1060 = *(undefined4 *)(local_1220 + uVar40);
              local_1040 = *(undefined4 *)(local_1200 + uVar40);
              uVar143 = *(undefined4 *)((long)&local_1320 + uVar40);
              local_1020._4_4_ = uVar143;
              local_1020._0_4_ = uVar143;
              local_1020._8_4_ = uVar143;
              local_1020._12_4_ = uVar143;
              local_1020._16_4_ = uVar143;
              local_1020._20_4_ = uVar143;
              local_1020._24_4_ = uVar143;
              local_1020._28_4_ = uVar143;
              uVar143 = *(undefined4 *)((long)local_11c0 + uVar40);
              uVar1 = *(undefined4 *)((long)local_11a0 + uVar40);
              local_10a0._4_4_ = uVar1;
              local_10a0._0_4_ = uVar1;
              local_10a0._8_4_ = uVar1;
              local_10a0._12_4_ = uVar1;
              local_10a0._16_4_ = uVar1;
              local_10a0._20_4_ = uVar1;
              local_10a0._24_4_ = uVar1;
              local_10a0._28_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)local_1180 + uVar40);
              local_1080._4_4_ = uVar1;
              local_1080._0_4_ = uVar1;
              local_1080._8_4_ = uVar1;
              local_1080._12_4_ = uVar1;
              local_1080._16_4_ = uVar1;
              local_1080._20_4_ = uVar1;
              local_1080._24_4_ = uVar1;
              local_1080._28_4_ = uVar1;
              local_1000._4_4_ = uVar32;
              local_1000._0_4_ = uVar32;
              local_1000._8_4_ = uVar32;
              local_1000._12_4_ = uVar32;
              local_1000._16_4_ = uVar32;
              local_1000._20_4_ = uVar32;
              local_1000._24_4_ = uVar32;
              local_1000._28_4_ = uVar32;
              local_10c0[0] = (RTCHitN)(char)uVar143;
              local_10c0[1] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[4] = (RTCHitN)(char)uVar143;
              local_10c0[5] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[8] = (RTCHitN)(char)uVar143;
              local_10c0[9] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[0xc] = (RTCHitN)(char)uVar143;
              local_10c0[0xd] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[0x10] = (RTCHitN)(char)uVar143;
              local_10c0[0x11] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)uVar143;
              local_10c0[0x15] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)uVar143;
              local_10c0[0x19] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)uVar143;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar143 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar143 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar143 >> 0x18);
              uStack_105c = local_1060;
              uStack_1058 = local_1060;
              uStack_1054 = local_1060;
              uStack_1050 = local_1060;
              uStack_104c = local_1060;
              uStack_1048 = local_1060;
              uStack_1044 = local_1060;
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar40);
              local_1420 = local_1140;
              local_15d0.valid = (int *)local_1420;
              local_15d0.geometryUserPtr = pGVar56->userPtr;
              local_15d0.context = context->user;
              local_15d0.hit = local_10c0;
              local_15d0.N = 8;
              local_15d0.ray = (RTCRayN *)ray;
              if (pGVar56->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_15a0._0_8_ = pGVar56;
                auVar67 = ZEXT1632(auVar122._0_16_);
                (*pGVar56->intersectionFilterN)(&local_15d0);
                auVar114 = ZEXT3264(auVar114._0_32_);
                auVar63 = ZEXT3264(auVar63._0_32_);
                auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                auVar122 = ZEXT3264(auVar67);
                pGVar56 = (Geometry *)local_15a0._0_8_;
              }
              auVar68 = vpcmpeqd_avx2(local_1420,_DAT_01f7b000);
              auVar67 = auVar122._0_32_ & ~auVar68;
              if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar67 >> 0x7f,0) == '\0') &&
                    (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar67 >> 0xbf,0) == '\0') &&
                  (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar67[0x1f]) {
                auVar68 = auVar68 ^ auVar122._0_32_;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar56->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar67 = ZEXT1632(auVar122._0_16_);
                  (*p_Var9)(&local_15d0);
                  auVar114 = ZEXT3264(auVar114._0_32_);
                  auVar63 = ZEXT3264(auVar63._0_32_);
                  auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                  auVar122 = ZEXT3264(auVar67);
                }
                auVar73 = vpcmpeqd_avx2(local_1420,_DAT_01f7b000);
                auVar68 = auVar73 ^ auVar122._0_32_;
                auVar67 = auVar122._0_32_ & ~auVar73;
                if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar67 >> 0x7f,0) != '\0') ||
                      (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar67 >> 0xbf,0) != '\0') ||
                    (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar67[0x1f] < '\0') {
                  auVar75._0_4_ = auVar73._0_4_ ^ auVar122._0_4_;
                  auVar75._4_4_ = auVar73._4_4_ ^ auVar122._4_4_;
                  auVar75._8_4_ = auVar73._8_4_ ^ auVar122._8_4_;
                  auVar75._12_4_ = auVar73._12_4_ ^ auVar122._12_4_;
                  auVar75._16_4_ = auVar73._16_4_ ^ auVar122._16_4_;
                  auVar75._20_4_ = auVar73._20_4_ ^ auVar122._20_4_;
                  auVar75._24_4_ = auVar73._24_4_ ^ auVar122._24_4_;
                  auVar75._28_4_ = auVar73._28_4_ ^ auVar122._28_4_;
                  auVar67 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])local_15d0.hit);
                  *(undefined1 (*) [32])(local_15d0.ray + 0x180) = auVar67;
                  auVar67 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0x20));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x1a0) = auVar67;
                  auVar67 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0x40));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x1c0) = auVar67;
                  auVar67 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0x60));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x1e0) = auVar67;
                  auVar67 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0x80));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x200) = auVar67;
                  auVar67 = vpmaskmovd_avx2(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x220) = auVar67;
                  auVar67 = vpmaskmovd_avx2(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x240) = auVar67;
                  auVar67 = vpmaskmovd_avx2(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x260) = auVar67;
                  auVar67 = vpmaskmovd_avx2(auVar75,*(undefined1 (*) [32])(local_15d0.hit + 0x100));
                  *(undefined1 (*) [32])(local_15d0.ray + 0x280) = auVar67;
                }
              }
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0x7f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar68 >> 0xbf,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar68[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar114._0_4_;
              }
              else {
                auVar114 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_1580 + uVar37 * 4) = 0;
              uVar143 = auVar114._0_4_;
              auVar62._4_4_ = uVar143;
              auVar62._0_4_ = uVar143;
              auVar62._8_4_ = uVar143;
              auVar62._12_4_ = uVar143;
              auVar62._16_4_ = uVar143;
              auVar62._20_4_ = uVar143;
              auVar62._24_4_ = uVar143;
              auVar62._28_4_ = uVar143;
              auVar67 = vcmpps_avx(auVar63._0_32_,auVar62,2);
              local_1580 = vandps_avx(auVar67,local_1580);
            }
            auVar117 = ZEXT3264(local_1580);
            if ((((((((local_1580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1580 >> 0x7f,0) == '\0') &&
                  (local_1580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1580 >> 0xbf,0) == '\0') &&
                (local_1580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1580[0x1f]) goto LAB_0160f35f;
            auVar74._8_4_ = 0x7f800000;
            auVar74._0_8_ = 0x7f8000007f800000;
            auVar74._12_4_ = 0x7f800000;
            auVar74._16_4_ = 0x7f800000;
            auVar74._20_4_ = 0x7f800000;
            auVar74._24_4_ = 0x7f800000;
            auVar74._28_4_ = 0x7f800000;
            auVar67 = vblendvps_avx(auVar74,auVar63._0_32_,local_1580);
            auVar68 = vshufps_avx(auVar67,auVar67,0xb1);
            auVar68 = vminps_avx(auVar67,auVar68);
            auVar73 = vshufpd_avx(auVar68,auVar68,5);
            auVar68 = vminps_avx(auVar68,auVar73);
            auVar73 = vpermpd_avx2(auVar68,0x4e);
            auVar68 = vminps_avx(auVar68,auVar73);
            auVar67 = vcmpps_avx(auVar67,auVar68,0);
            auVar68 = local_1580 & auVar67;
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              auVar67 = vandps_avx(auVar67,local_1580);
              auVar117 = ZEXT3264(auVar67);
            }
            goto LAB_0160ef02;
          }
        }
      }
LAB_0160f35f:
      auVar117 = ZEXT1664(local_1370);
      auVar122 = ZEXT1664(local_1380);
      auVar132 = ZEXT1664(local_1390);
      auVar114 = ZEXT1664(local_1550);
      fVar133 = local_13a0;
      fVar136 = fStack_139c;
      fVar137 = fStack_1398;
      fVar99 = fStack_1394;
      fVar138 = local_13b0;
      fVar105 = fStack_13ac;
      fVar106 = fStack_13a8;
      fVar107 = fStack_13a4;
      fVar140 = local_13c0;
      fVar108 = fStack_13bc;
      fVar109 = fStack_13b8;
      fVar110 = fStack_13b4;
      fVar141 = local_13d0;
      fVar146 = fStack_13cc;
      fVar148 = fStack_13c8;
      fVar150 = fStack_13c4;
      fVar155 = local_13e0;
      fVar159 = fStack_13dc;
      fVar160 = fStack_13d8;
      fVar161 = fStack_13d4;
      fVar162 = local_13f0;
      fVar165 = fStack_13ec;
      fVar118 = fStack_13e8;
      fVar123 = fStack_13e4;
    }
    uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar63 = ZEXT1664(CONCAT412(uVar143,CONCAT48(uVar143,CONCAT44(uVar143,uVar143))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }